

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

value * __thiscall
mjs::anon_unknown_35::encode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  wchar_t *src;
  wchar_t ch;
  gc_heap *this_00;
  value *pvVar1;
  bool bVar2;
  char *pcVar3;
  conversion_result cVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t buffer [4];
  wstring res;
  byte local_8c [4];
  gc_heap_ptr_untyped local_88;
  anon_unknown_35 *local_78;
  wstring local_70;
  value *local_50;
  gc_heap_ptr<mjs::global_object> *local_48;
  wstring_view local_40;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = L'\0';
  local_78 = this;
  local_50 = __return_storage_ptr__;
  if ((int)global != 0) {
    uVar7 = 0;
    local_48 = global;
    do {
      src = (wchar_t *)(s._M_len + uVar7 * 4);
      ch = *src;
      bVar2 = anon_unknown_5::is_uri_unescaped(ch);
      if (bVar2) {
LAB_0013dc61:
        cVar4.length = 1;
        cVar4.code_point = L'\0';
        std::__cxx11::wstring::push_back((wchar_t)&local_70);
      }
      else {
        local_88.heap_._0_1_ = (undefined1)ch;
        pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (";/?:@&=+$,","",&local_88);
        if ((ch == L'#') || (pcVar3 != "")) goto LAB_0013dc61;
        cVar4 = unicode::utf16_to_utf32<wchar_t>(src,(int)global - (int)uVar7);
        if (cVar4.length == 0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = &PTR__exception_001d41f0;
          __cxa_throw(puVar5,&(anonymous_namespace)::(anonymous_namespace)::encoder_exception::
                              typeinfo,std::exception::~exception);
        }
        uVar6 = unicode::utf32_to_utf8<unsigned_char>(cVar4.code_point,local_8c);
        if (uVar6 == 0) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = &PTR__exception_001d41f0;
          __cxa_throw(puVar5,&(anonymous_namespace)::(anonymous_namespace)::encoder_exception::
                              typeinfo,std::exception::~exception);
        }
        uVar8 = 0;
        do {
          anon_unknown_5::put_percent_hex_byte(&local_70,(uint)local_8c[uVar8]);
          uVar8 = uVar8 + 1;
          global = local_48;
        } while (uVar6 != uVar8);
      }
      uVar6 = (int)uVar7 + cVar4.length;
      uVar7 = (ulong)uVar6;
    } while (uVar6 < (uint)global);
  }
  local_40._M_len = local_70._M_string_length;
  local_40._M_str = local_70._M_dataplus._M_p;
  string::string((string *)&local_88,*(gc_heap **)local_78,&local_40);
  pvVar1 = local_50;
  local_50->type_ = string;
  this_00 = (gc_heap *)CONCAT71(local_88.heap_._1_7_,local_88.heap_._0_1_);
  (local_50->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = this_00
  ;
  *(uint32_t *)((long)&local_50->field_1 + 8) = local_88.pos_;
  if (this_00 != (gc_heap *)0x0) {
    gc_heap::attach(this_00,(gc_heap_ptr_untyped *)&(local_50->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT44(local_70.field_2._M_local_buf[1],local_70.field_2._M_local_buf[0]) * 4
                    + 4);
  }
  return pvVar1;
}

Assistant:

value encode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    return encode_uri_helper(global, s, [](int ch) { return is_uri_unescaped(ch) || is_uri_reserved(ch) || ch == '#'; } );
}